

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Scalar *pSVar1;
  size_type sVar2;
  long in_RCX;
  ulong uVar3;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_RDI;
  int in_R8D;
  uint b;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar4;
  Tensor *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar5;
  
  if (in_R8D != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes.cc"
                  ,0x618,
                  "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (*(long *)(in_RDI + 0x58) == 0) {
    if (*(long *)(in_RDI + 0x78) == 0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes.cc"
                    ,0x61f,
                    "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    for (uVar5 = 0; uVar3 = (ulong)uVar5,
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78))
        , uVar3 < sVar2; uVar5 = uVar5 + 1) {
      fVar4 = *(float *)(*(long *)(in_RCX + 0x28) + (ulong)uVar5 * 4);
      Tensor::batch_matrix
                ((Tensor *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78),
                 (ulong)uVar5);
      pSVar1 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(in_RDI,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *pSVar1 = fVar4 + *pSVar1;
    }
  }
  else {
    fVar4 = **(float **)(in_RCX + 0x28);
    Tensor::operator*(in_stack_ffffffffffffff98);
    pSVar1 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(in_RDI,CONCAT44(fVar4,in_stack_ffffffffffffff78));
    *pSVar1 = fVar4 + *pSVar1;
  }
  return;
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    (*dEdxi)(*pval) += dEdf.v[0];
  } else {
    assert(pvals);
    for(unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.batch_matrix(b)((*pvals)[b]) += dEdf.v[b];
  }
#endif
}